

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

int Abc_GateToType(Abc_Obj_t *pObj)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *__s1;
  
  __s1 = Mio_GateReadName((Mio_Gate_t *)(pObj->field_5).pData);
  cVar1 = *__s1;
  if (cVar1 == 'a') {
    if (__s1[1] != 'n') goto LAB_0088e595;
    if (__s1[2] == 'd') {
      return 0xd;
    }
    iVar3 = strncmp(__s1,"nand",4);
    if (iVar3 == 0) {
      return 0xe;
    }
  }
  else {
    if (cVar1 == 'i') {
      if ((__s1[1] == 'n') && (__s1[2] == 'v')) {
        return 0xc;
      }
    }
    else if (((cVar1 == 'b') && (__s1[1] == 'u')) && (__s1[2] == 'f')) {
      return 0xb;
    }
LAB_0088e595:
    iVar3 = strncmp(__s1,"nand",4);
    if (iVar3 == 0) {
      return 0xe;
    }
    if (cVar1 == 'n') {
      if (__s1[1] == 'o') {
        iVar3 = 0x10;
LAB_0088e5f1:
        if (__s1[2] == 'r') {
          return iVar3;
        }
      }
    }
    else if (cVar1 == 'x') {
      if (__s1[1] == 'o') {
        iVar3 = 0x11;
        goto LAB_0088e5f1;
      }
    }
    else if (cVar1 == 'o') {
      bVar2 = true;
      if (__s1[1] == 'r') {
        return 0xf;
      }
      goto LAB_0088e5f9;
    }
  }
  bVar2 = false;
LAB_0088e5f9:
  iVar3 = strncmp(__s1,"xnor",4);
  if (iVar3 == 0) {
    return 0x12;
  }
  iVar3 = strncmp(__s1,"zero",4);
  if (iVar3 == 0) {
    return 7;
  }
  if (((bVar2) && (__s1[1] == 'n')) && (__s1[2] == 'e')) {
    return 8;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                ,0xc2a,"int Abc_GateToType(Abc_Obj_t *)");
}

Assistant:

int Abc_GateToType( Abc_Obj_t * pObj )
{
    char * pGateName = Mio_GateReadName((Mio_Gate_t *)pObj->pData);
    if ( !strncmp(pGateName, "buf",  3) )  return ABC_OPER_BIT_BUF;
    if ( !strncmp(pGateName, "inv",  3) )  return ABC_OPER_BIT_INV;
    if ( !strncmp(pGateName, "and",  3) )  return ABC_OPER_BIT_AND;
    if ( !strncmp(pGateName, "nand", 4) )  return ABC_OPER_BIT_NAND;
    if ( !strncmp(pGateName, "or",   2) )  return ABC_OPER_BIT_OR;
    if ( !strncmp(pGateName, "nor",  3) )  return ABC_OPER_BIT_NOR;
    if ( !strncmp(pGateName, "xor",  3) )  return ABC_OPER_BIT_XOR;
    if ( !strncmp(pGateName, "xnor", 4) )  return ABC_OPER_BIT_NXOR;
    if ( !strncmp(pGateName, "zero", 4) )  return ABC_OPER_CONST_F;
    if ( !strncmp(pGateName, "one",  3) )  return ABC_OPER_CONST_T;
    assert( 0 );
    return -1;
}